

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_pecompute_haar(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  float *pfVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  float *data;
  long lVar24;
  long lVar25;
  float *pfVar26;
  int iVar27;
  ulong uVar28;
  float *pfVar29;
  int iVar30;
  float *pfVar31;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  float *pfVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  long lVar39;
  float *pfVar40;
  float *pfVar41;
  int scale;
  int iVar42;
  float *pfVar43;
  int k_count;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 in_ZMM9 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  undefined1 auVar75 [64];
  int data_width;
  int local_a8;
  
  fVar57 = ipoint->scale;
  auVar75 = ZEXT464((uint)fVar57);
  auVar52._8_4_ = 0x3effffff;
  auVar52._0_8_ = 0x3effffff3effffff;
  auVar52._12_4_ = 0x3effffff;
  auVar51._8_4_ = 0x80000000;
  auVar51._0_8_ = 0x8000000080000000;
  auVar51._12_4_ = 0x80000000;
  auVar53 = ZEXT416((uint)fVar57);
  auVar44 = vpternlogd_avx512vl(auVar52,auVar53,auVar51,0xf8);
  fVar60 = -0.08 / (fVar57 * fVar57);
  auVar44 = ZEXT416((uint)(fVar57 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar50._0_8_ = (double)fVar57;
  auVar50._8_8_ = 0;
  scale = (int)auVar44._0_4_;
  auVar45 = vpternlogd_avx512vl(auVar52,ZEXT416((uint)ipoint->x),auVar51,0xf8);
  auVar45 = ZEXT416((uint)(ipoint->x + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46._0_8_ = (double)auVar45._0_4_;
  auVar46._8_8_ = auVar45._8_8_;
  auVar45 = vfmadd231sd_fma(auVar46,auVar50,ZEXT816(0x3fe0000000000000));
  auVar49._0_4_ = (float)auVar45._0_8_;
  auVar49._4_12_ = auVar45._4_12_;
  auVar45 = vpternlogd_avx512vl(auVar52,ZEXT416((uint)ipoint->y),auVar51,0xf8);
  auVar45 = ZEXT416((uint)(ipoint->y + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar47._0_8_ = (double)auVar45._0_4_;
  auVar47._8_8_ = auVar45._8_8_;
  auVar45 = vfmadd231sd_fma(auVar47,auVar50,ZEXT816(0x3fe0000000000000));
  auVar48._0_4_ = (float)auVar45._0_8_;
  auVar48._4_12_ = auVar45._4_12_;
  auVar45._0_4_ = (int)auVar44._0_4_;
  auVar45._4_4_ = (int)auVar44._4_4_;
  auVar45._8_4_ = (int)auVar44._8_4_;
  auVar45._12_4_ = (int)auVar44._12_4_;
  auVar44 = vcvtdq2ps_avx(auVar45);
  fVar2 = auVar49._0_4_ - auVar44._0_4_;
  fVar74 = auVar48._0_4_ - auVar44._0_4_;
  auVar44 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar53,auVar49);
  auVar45 = vpternlogd_avx512vl(auVar52,auVar44,auVar51,0xf8);
  auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar45._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = ZEXT416((uint)fVar57);
  if (scale < (int)auVar44._0_4_) {
    auVar54._8_4_ = 0x3effffff;
    auVar54._0_8_ = 0x3effffff3effffff;
    auVar54._12_4_ = 0x3effffff;
    auVar55._8_4_ = 0x80000000;
    auVar55._0_8_ = 0x8000000080000000;
    auVar55._12_4_ = 0x80000000;
    auVar44 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar53,auVar48);
    auVar46 = vpternlogd_avx512vl(auVar55,auVar44,auVar54,0xea);
    auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar46._0_4_));
    auVar44 = vroundss_avx(auVar44,auVar44,0xb);
    if (scale < (int)auVar44._0_4_) {
      auVar44 = vfmadd231ss_fma(auVar49,auVar53,ZEXT416(0x41300000));
      auVar53._8_4_ = 0x80000000;
      auVar53._0_8_ = 0x8000000080000000;
      auVar53._12_4_ = 0x80000000;
      auVar46 = vpternlogd_avx512vl(auVar53,auVar44,auVar54,0xea);
      auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar46._0_4_));
      auVar44 = vroundss_avx(auVar44,auVar44,0xb);
      if ((int)auVar44._0_4_ + scale <= iimage->width) {
        auVar44 = vfmadd231ss_fma(auVar48,auVar45,ZEXT416(0x41300000));
        auVar65._8_4_ = 0x80000000;
        auVar65._0_8_ = 0x8000000080000000;
        auVar65._12_4_ = 0x80000000;
        auVar46 = vpternlogd_avx512vl(auVar65,auVar44,auVar54,0xea);
        auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar46._0_4_));
        auVar44 = vroundss_avx(auVar44,auVar44,0xb);
        if ((int)auVar44._0_4_ + scale <= iimage->height) {
          auVar44._8_4_ = 0x80000000;
          auVar44._0_8_ = 0x8000000080000000;
          auVar44._12_4_ = 0x80000000;
          iVar1 = iimage->data_width;
          pfVar18 = iimage->data;
          lVar21 = 0;
          iVar17 = -0xc;
          pfVar20 = haarResponseX;
          pfVar35 = haarResponseY;
          do {
            auVar68._0_4_ = (float)iVar17;
            auVar68._4_12_ = in_ZMM9._4_12_;
            auVar46 = vfmadd213ss_fma(auVar68,auVar45,ZEXT416((uint)fVar74));
            lVar25 = 0;
            auVar47 = vpternlogd_avx512vl(auVar54,auVar46,auVar44,0xf8);
            auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
            auVar46 = vroundss_avx(auVar46,auVar46,0xb);
            iVar38 = (int)auVar46._0_4_;
            iVar22 = (iVar38 + -1) * iVar1;
            iVar30 = (iVar38 + -1 + scale) * iVar1;
            iVar38 = (iVar38 + -1 + scale * 2) * iVar1;
            do {
              auVar69._0_4_ = (float)((int)lVar25 + -0xc);
              auVar69._4_12_ = in_ZMM9._4_12_;
              auVar46 = vfmadd213ss_fma(auVar69,auVar45,ZEXT416((uint)fVar2));
              auVar47 = vpternlogd_avx512vl(auVar54,auVar46,auVar44,0xf8);
              auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
              auVar46 = vroundss_avx(auVar46,auVar46,0xb);
              iVar34 = (int)auVar46._0_4_;
              iVar36 = iVar34 + -1 + scale;
              iVar27 = iVar34 + -1 + scale * 2;
              fVar57 = pfVar18[iVar38 + -1 + iVar34];
              fVar3 = pfVar18[iVar22 + iVar27];
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar18[iVar22 + iVar36] -
                                                      pfVar18[iVar36 + iVar38])),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(pfVar18[iVar27 + iVar38] -
                                                      pfVar18[iVar22 + -1 + iVar34])));
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar18[iVar30 + -1 + iVar34] -
                                                      pfVar18[iVar30 + iVar27])),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(pfVar18[iVar27 + iVar38] -
                                                      pfVar18[iVar22 + -1 + iVar34])));
              pfVar20[lVar25] = (fVar57 - fVar3) + auVar46._0_4_;
              pfVar35[lVar25] = auVar47._0_4_ - (fVar57 - fVar3);
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0x18);
            pfVar35 = pfVar35 + 0x18;
            pfVar20 = pfVar20 + 0x18;
            iVar17 = iVar17 + 1;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x18);
          goto LAB_0017cc80;
        }
      }
    }
  }
  iVar1 = scale * 2;
  iVar17 = -0xc;
  lVar25 = 0;
  lVar21 = 0;
  do {
    auVar58._0_4_ = (float)iVar17;
    auVar58._4_12_ = in_ZMM9._4_12_;
    auVar44 = vfmadd213ss_fma(auVar58,auVar75._0_16_,ZEXT416((uint)fVar74));
    auVar61._8_4_ = 0x3effffff;
    auVar61._0_8_ = 0x3effffff3effffff;
    auVar61._12_4_ = 0x3effffff;
    lVar39 = 0;
    auVar14._8_4_ = 0x80000000;
    auVar14._0_8_ = 0x8000000080000000;
    auVar14._12_4_ = 0x80000000;
    auVar46 = vpternlogd_avx512vl(auVar61,auVar44,auVar14,0xf8);
    auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar46._0_4_));
    auVar44 = vroundss_avx(auVar44,auVar44,0xb);
    iVar38 = (int)auVar44._0_4_;
    pfVar18 = haarResponseX;
    pfVar20 = haarResponseY;
    lVar24 = lVar25;
    do {
      auVar62._8_4_ = 0x3effffff;
      auVar62._0_8_ = 0x3effffff3effffff;
      auVar62._12_4_ = 0x3effffff;
      auVar59._0_4_ = (float)((int)lVar39 + -0xc);
      auVar59._4_12_ = in_ZMM9._4_12_;
      auVar44 = vfmadd213ss_fma(auVar59,auVar75._0_16_,ZEXT416((uint)fVar2));
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar46 = vpternlogd_avx512vl(auVar62,auVar44,auVar15,0xf8);
      auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar46._0_4_));
      auVar44 = vroundss_avx(auVar44,auVar44,0xb);
      iVar22 = (int)auVar44._0_4_;
      if ((((iVar38 < 1) || (iVar22 < 1)) || (iimage->height < iVar1 + iVar38)) ||
         (iVar30 = iVar1 + iVar22, iimage->width < iVar30)) {
        haarXY(iimage,iVar38,iVar22,scale,(float *)((long)pfVar18 + lVar24),
               (float *)((long)pfVar20 + lVar24));
        auVar75 = ZEXT1664(auVar45);
        pfVar18 = haarResponseX;
        pfVar20 = haarResponseY;
      }
      else {
        iVar36 = iimage->data_width;
        iVar34 = iVar22 + -1 + scale;
        pfVar35 = iimage->data;
        iVar42 = iVar36 * (iVar38 + -1);
        iVar27 = iVar36 * (iVar38 + -1 + scale);
        iVar36 = iVar36 * (iVar1 + -1 + iVar38);
        fVar57 = pfVar35[iVar36 + -1 + iVar22];
        fVar3 = pfVar35[iVar42 + -1 + iVar30];
        auVar44 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar42 + iVar34] - pfVar35[iVar36 + iVar34]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar35[iVar36 + -1 + iVar30] -
                                                pfVar35[iVar42 + -1 + iVar22])));
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar27 + -1 + iVar22] -
                                                pfVar35[iVar27 + -1 + iVar30])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar35[iVar36 + -1 + iVar30] -
                                                pfVar35[iVar42 + -1 + iVar22])));
        *(float *)((long)pfVar18 + lVar24) = (fVar57 - fVar3) + auVar44._0_4_;
        *(float *)((long)pfVar20 + lVar24) = auVar46._0_4_ - (fVar57 - fVar3);
      }
      lVar39 = lVar39 + 1;
      lVar24 = lVar24 + 4;
    } while (lVar39 != 0x18);
    iVar17 = iVar17 + 1;
    lVar21 = lVar21 + 1;
    lVar25 = lVar25 + 0x60;
  } while (lVar21 != 0x18);
LAB_0017cc80:
  fVar74 = auVar75._0_4_;
  auVar73._8_4_ = 0x3effffff;
  auVar73._0_8_ = 0x3effffff3effffff;
  auVar73._12_4_ = 0x3effffff;
  auVar72._8_4_ = 0x80000000;
  auVar72._0_8_ = 0x8000000080000000;
  auVar72._12_4_ = 0x80000000;
  auVar44 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 0.5)),auVar72,0xf8);
  auVar44 = ZEXT416((uint)(fVar74 * 0.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 1.5)),auVar72,0xf8);
  auVar45 = ZEXT416((uint)(fVar74 * 1.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 2.5)),auVar72,0xf8);
  auVar46 = ZEXT416((uint)(fVar74 * 2.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 3.5)),auVar72,0xf8);
  auVar47 = ZEXT416((uint)(fVar74 * 3.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 4.5)),auVar72,0xf8);
  auVar48 = ZEXT416((uint)(fVar74 * 4.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 5.5)),auVar72,0xf8);
  auVar49 = ZEXT416((uint)(fVar74 * 5.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 6.5)),auVar72,0xf8);
  auVar50 = ZEXT416((uint)(fVar74 * 6.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 7.5)),auVar72,0xf8);
  auVar51 = ZEXT416((uint)(auVar51._0_4_ + fVar74 * 7.5));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 8.5)),auVar72,0xf8);
  auVar52 = ZEXT416((uint)(fVar74 * 8.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 9.5)),auVar72,0xf8);
  auVar53 = ZEXT416((uint)(fVar74 * 9.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 10.5)),auVar72,0xf8);
  auVar54 = ZEXT416((uint)(fVar74 * 10.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)(fVar74 * 11.5)),auVar72,0xf8);
  fVar64 = auVar46._0_4_;
  fVar57 = fVar64 + auVar45._0_4_;
  fVar2 = fVar64 + auVar44._0_4_;
  auVar46 = ZEXT416((uint)(fVar74 * 11.5 + auVar55._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  fVar74 = fVar64 - auVar44._0_4_;
  fVar3 = fVar64 - auVar45._0_4_;
  fVar4 = fVar64 - auVar47._0_4_;
  fVar5 = fVar64 - auVar48._0_4_;
  fVar6 = fVar64 - auVar49._0_4_;
  fVar64 = fVar64 - auVar50._0_4_;
  fVar71 = auVar51._0_4_;
  fVar7 = fVar71 - auVar47._0_4_;
  fVar8 = fVar71 - auVar48._0_4_;
  fVar9 = fVar71 - auVar49._0_4_;
  fVar10 = fVar71 - auVar50._0_4_;
  fVar11 = fVar71 - auVar52._0_4_;
  fVar12 = fVar71 - auVar53._0_4_;
  fVar13 = fVar71 - auVar54._0_4_;
  fVar71 = fVar71 - auVar46._0_4_;
  gauss_s1_c0[0] = expf(fVar57 * fVar57 * fVar60);
  gauss_s1_c0[1] = expf(fVar2 * fVar2 * fVar60);
  gauss_s1_c0[2] = expf(fVar74 * fVar74 * fVar60);
  gauss_s1_c0[3] = expf(fVar3 * fVar3 * fVar60);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar4 * fVar4 * fVar60);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar60);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar60);
  gauss_s1_c0[8] = expf(fVar64 * fVar64 * fVar60);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar60);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar60);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar60);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar60);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar60);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar60);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar60);
  gauss_s1_c1[8] = expf(fVar71 * fVar71 * fVar60);
  auVar63._8_4_ = 0x7fffffff;
  auVar63._0_8_ = 0x7fffffff7fffffff;
  auVar63._12_4_ = 0x7fffffff;
  uVar33 = 0xfffffff8;
  fVar57 = 0.0;
  lVar21 = 0;
  local_a8 = 0;
  pfVar18 = haarResponseX;
  pfVar20 = haarResponseY;
  do {
    uVar32 = (uint)uVar33;
    pfVar35 = gauss_s1_c0;
    lVar25 = (long)local_a8;
    lVar21 = (long)(int)lVar21;
    uVar23 = 0xfffffff8;
    if (uVar32 == 7) {
      pfVar35 = gauss_s1_c1;
    }
    if (uVar32 == 0xfffffff8) {
      pfVar35 = gauss_s1_c1;
    }
    uVar37 = 0;
    local_a8 = local_a8 + 4;
    pfVar29 = pfVar18;
    pfVar40 = pfVar20;
    do {
      pfVar31 = gauss_s1_c0;
      auVar75 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar23 == 7) {
        pfVar31 = gauss_s1_c1;
      }
      if (uVar23 == 0xfffffff8) {
        pfVar31 = gauss_s1_c1;
      }
      uVar19 = (ulong)(uVar23 >> 0x1c & 0xfffffff8);
      pfVar26 = pfVar29;
      uVar28 = uVar37;
      pfVar41 = pfVar40;
      do {
        lVar24 = 0;
        pfVar43 = (float *)((long)pfVar35 + (ulong)(uint)((int)(uVar33 >> 0x1f) << 5));
        do {
          fVar2 = pfVar31[uVar19] * *pfVar43;
          pfVar43 = pfVar43 + (ulong)(~uVar32 >> 0x1f) * 2 + -1;
          auVar44 = vinsertps_avx(ZEXT416((uint)pfVar41[lVar24]),ZEXT416((uint)pfVar26[lVar24]),0x10
                                 );
          lVar24 = lVar24 + 1;
          auVar70._0_4_ = fVar2 * auVar44._0_4_;
          auVar70._4_4_ = fVar2 * auVar44._4_4_;
          auVar70._8_4_ = fVar2 * auVar44._8_4_;
          auVar70._12_4_ = fVar2 * auVar44._12_4_;
          auVar44 = vandps_avx(auVar70,auVar63);
          auVar44 = vmovlhps_avx(auVar70,auVar44);
          auVar66._0_4_ = auVar75._0_4_ + auVar44._0_4_;
          auVar66._4_4_ = auVar75._4_4_ + auVar44._4_4_;
          auVar66._8_4_ = auVar75._8_4_ + auVar44._8_4_;
          auVar66._12_4_ = auVar75._12_4_ + auVar44._12_4_;
          auVar75 = ZEXT1664(auVar66);
        } while (lVar24 != 9);
        uVar28 = uVar28 + 0x18;
        uVar19 = uVar19 + (ulong)(-1 < (int)uVar23) * 2 + -1;
        pfVar26 = pfVar26 + 0x18;
        pfVar41 = pfVar41 + 0x18;
      } while (uVar28 < uVar23 * 0x18 + 0x198);
      uVar23 = uVar23 + 5;
      uVar37 = uVar37 + 0x78;
      fVar2 = gauss_s2_arr[lVar25];
      auVar16._4_4_ = fVar2;
      auVar16._0_4_ = fVar2;
      auVar16._8_4_ = fVar2;
      auVar16._12_4_ = fVar2;
      auVar47 = vmulps_avx512vl(auVar66,auVar16);
      lVar25 = lVar25 + 1;
      auVar67._0_4_ = auVar47._0_4_ * auVar47._0_4_;
      auVar67._4_4_ = auVar47._4_4_ * auVar47._4_4_;
      auVar67._8_4_ = auVar47._8_4_ * auVar47._8_4_;
      auVar67._12_4_ = auVar47._12_4_ * auVar47._12_4_;
      auVar45 = vshufpd_avx(auVar47,auVar47,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar21) = auVar47;
      lVar21 = lVar21 + 4;
      pfVar29 = pfVar29 + 0x78;
      pfVar40 = pfVar40 + 0x78;
      auVar44 = vmovshdup_avx(auVar67);
      auVar46 = vfmadd231ss_fma(auVar44,auVar47,auVar47);
      auVar44 = vshufps_avx(auVar47,auVar47,0xff);
      auVar45 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      auVar44 = vfmadd213ss_fma(auVar44,auVar44,auVar45);
      fVar57 = fVar57 + auVar44._0_4_;
    } while (local_a8 != (int)lVar25);
    pfVar18 = pfVar18 + 5;
    pfVar20 = pfVar20 + 5;
    uVar33 = (ulong)(uVar32 + 5);
  } while ((int)uVar32 < 3);
  if (fVar57 < 0.0) {
    fVar57 = sqrtf(fVar57);
  }
  else {
    auVar44 = vsqrtss_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57));
    fVar57 = auVar44._0_4_;
  }
  lVar21 = 0;
  auVar75 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar57)));
  do {
    auVar56 = vmulps_avx512f(auVar75,*(undefined1 (*) [64])(ipoint->descriptor + lVar21));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar21) = auVar56;
    lVar21 = lVar21 + 0x10;
  } while (lVar21 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_pecompute_haar(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_gauss_compute_once_array
        - precompute haar wavelet responses and store them in two 24x24 arrays
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, ++k_count) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    /*
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                // int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                // int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    // int sample_x = (int) roundf(ipoint_x + k * scale);

                    //Get x coords of sample point
                    // int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[(l+12)*24+(k+12)];
                    float ry = haarResponseY[(l+12)*24+(k+12)];
                    // haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}